

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O1

bool __thiscall re2::BitState::GrowStack(BitState *this)

{
  int iVar1;
  int iVar2;
  Job *__src;
  Job *__dest;
  ulong uVar3;
  LogMessage local_1a0;
  
  iVar1 = this->maxjob_;
  this->maxjob_ = iVar1 * 2;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (long)iVar1) {
    uVar3 = (long)iVar1 << 5;
  }
  __dest = (Job *)operator_new__(uVar3);
  __src = this->job_;
  memmove(__dest,__src,(long)this->njob_ << 4);
  if (__src != (Job *)0x0) {
    operator_delete__(__src);
  }
  this->job_ = __dest;
  iVar1 = this->njob_;
  iVar2 = this->maxjob_;
  if (iVar2 <= iVar1) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc",
               0x71,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Job stack overflow.",0x13);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  return iVar1 < iVar2;
}

Assistant:

bool BitState::GrowStack() {
  // VLOG(0) << "Reallocate.";
  maxjob_ *= 2;
  Job* newjob = new Job[maxjob_];
  memmove(newjob, job_, njob_*sizeof job_[0]);
  delete[] job_;
  job_ = newjob;
  if (njob_ >= maxjob_) {
    LOG(DFATAL) << "Job stack overflow.";
    return false;
  }
  return true;
}